

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall despot::MemoryPool<despot::TagState>::NewChunk(MemoryPool<despot::TagState> *this)

{
  Chunk *this_00;
  int i;
  uint uVar1;
  Chunk *chunk;
  Chunk *local_30;
  TagState *local_28;
  
  this_00 = (Chunk *)operator_new(0x2000);
  Chunk::Chunk(this_00);
  local_30 = this_00;
  std::
  vector<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ::push_back(&this->chunks_,&local_30);
  for (uVar1 = 0xff; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    local_28 = local_30->Objects + uVar1;
    std::vector<despot::TagState*,std::allocator<despot::TagState*>>::
    emplace_back<despot::TagState*>
              ((vector<despot::TagState*,std::allocator<despot::TagState*>> *)&this->freelist_,
               &local_28);
    local_30->Objects[uVar1].field_0x8 = 0;
  }
  return;
}

Assistant:

void NewChunk() {
		Chunk* chunk = new Chunk;
		chunks_.push_back(chunk);
		for (int i = Chunk::Size - 1; i >= 0; --i) {
			freelist_.push_back(&chunk->Objects[i]);
			chunk->Objects[i].ClearAllocated();
		}
	}